

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ImageButtonEx
               (ImGuiID id,ImTextureID texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
               ImVec2 *padding,ImVec4 *bg_col,ImVec4 *tint_col)

{
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar3;
  undefined1 uVar4;
  bool bVar5;
  ImU32 IVar6;
  undefined7 extraout_var;
  ImGuiCol idx;
  ImGuiContext *g;
  float fVar7;
  float fVar8;
  ImRect bb;
  bool local_72;
  bool local_71;
  ImRect local_70;
  undefined8 local_60;
  ImVec2 *local_58;
  ImTextureID local_50;
  ImVec2 *local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    local_70.Min.x = (pIVar1->DC).CursorPos.x;
    local_70.Min.y = (pIVar1->DC).CursorPos.y;
    fVar7 = (*padding).x;
    fVar8 = (*padding).y;
    local_70.Max.x = fVar7 + fVar7 + (*size).x + local_70.Min.x;
    local_70.Max.y = fVar8 + fVar8 + (*size).y + local_70.Min.y;
    local_50 = texture_id;
    local_48 = uv0;
    ItemSize(&local_70,-1.0);
    local_60 = 0;
    bVar5 = ItemAdd(&local_70,id,(ImRect *)0x0,0);
    if (bVar5) {
      local_58 = uv1;
      bVar5 = ButtonBehavior(&local_70,id,&local_72,&local_71,0);
      local_60 = CONCAT71(extraout_var,bVar5);
      if ((local_71 != true) || (idx = 0x17, local_72 == false)) {
        idx = local_72 + 0x15;
      }
      IVar6 = GetColorU32(idx,1.0);
      RenderNavHighlight(&local_70,id,1);
      p_min.y = local_70.Min.y;
      p_min.x = local_70.Min.x;
      p_max.y = local_70.Max.y;
      p_max.x = local_70.Max.x;
      fVar7 = padding->x;
      if (padding->y <= padding->x) {
        fVar7 = padding->y;
      }
      fVar8 = (pIVar3->Style).FrameRounding;
      if (fVar7 <= fVar8) {
        fVar8 = fVar7;
      }
      RenderFrame(p_min,p_max,IVar6,true,(float)(~-(uint)(fVar7 < 0.0) & (uint)fVar8));
      if (0.0 < bg_col->w) {
        pIVar2 = pIVar1->DrawList;
        fVar7 = (*padding).x;
        fVar8 = (*padding).y;
        local_38.x = local_70.Min.x + fVar7;
        local_38.y = local_70.Min.y + fVar8;
        local_40.x = local_70.Max.x - fVar7;
        local_40.y = local_70.Max.y - fVar8;
        IVar6 = GetColorU32(bg_col);
        ImDrawList::AddRectFilled(pIVar2,&local_38,&local_40,IVar6,0.0,0);
      }
      pIVar2 = pIVar1->DrawList;
      fVar7 = (*padding).x;
      fVar8 = (*padding).y;
      local_38.x = local_70.Min.x + fVar7;
      local_38.y = local_70.Min.y + fVar8;
      local_40.x = local_70.Max.x - fVar7;
      local_40.y = local_70.Max.y - fVar8;
      IVar6 = GetColorU32(tint_col);
      ImDrawList::AddImage(pIVar2,local_50,&local_38,&local_40,local_48,local_58,IVar6);
    }
    uVar4 = (undefined1)local_60;
  }
  else {
    uVar4 = 0;
  }
  return (bool)uVar4;
}

Assistant:

bool ImGui::ImageButtonEx(ImGuiID id, ImTextureID texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, const ImVec2& padding, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size + padding * 2);
    ItemSize(bb);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, ImClamp((float)ImMin(padding.x, padding.y), 0.0f, g.Style.FrameRounding));
    if (bg_col.w > 0.0f)
        window->DrawList->AddRectFilled(bb.Min + padding, bb.Max - padding, GetColorU32(bg_col));
    window->DrawList->AddImage(texture_id, bb.Min + padding, bb.Max - padding, uv0, uv1, GetColorU32(tint_col));

    return pressed;
}